

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result)

{
  SymbolKind SVar1;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this;
  Scope *pSVar2;
  WildcardImportSymbol *this_00;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  optional<slang::SourceRange> sourceRange_00;
  string_view lookupName;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view name_00;
  ulong uVar3;
  iterator iVar4;
  PackageSymbol *pPVar5;
  long *__dest;
  Symbol *pSVar6;
  Diagnostic *pDVar7;
  Type *pTVar8;
  Type *pTVar9;
  SubroutineSymbol *pSVar10;
  DeclaredType *pDVar11;
  Scope *pSVar12;
  size_type sVar13;
  SymbolIndex SVar14;
  long *plVar15;
  Symbol *symbol;
  long *__dest_00;
  size_t __n;
  long lVar16;
  SymbolIndex SVar17;
  ulong capacity;
  long lVar18;
  bool bVar19;
  span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> sVar20;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar21;
  LookupLocation location_00;
  Symbol *imported;
  SmallVector<Import,_4UL> imports;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  importDedup;
  string_view local_130;
  size_type local_120;
  Symbol *local_118;
  long *local_110;
  ulong local_108;
  size_t local_100;
  long local_f8 [8];
  SubroutineSymbol *local_b8;
  Scope *local_b0;
  pointer local_a8;
  anon_class_32_4_2e62d3a1 local_a0;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL> local_80;
  sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  local_58;
  
  pSVar12 = location.scope;
  local_130._M_str = name._M_str;
  local_130._M_len = name._M_len;
  SVar14 = location.index;
  local_a0.sourceRange = &sourceRange;
  local_a0.name = &local_130;
  local_a0.result = result;
  local_a0.scope = scope;
  if (scope->deferredMemberIndex != Invalid) {
    Scope::elaborate(scope);
  }
  this = &scope->nameMap->
          super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ;
  iVar4 = ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
          ::find(this,&local_130);
  if (iVar4.current == this->entries + this->num_slots_minus_one + (long)this->max_lookups) {
    pSVar10 = (SubroutineSymbol *)0x0;
    goto LAB_002766ae;
  }
  pSVar10 = (SubroutineSymbol *)((iVar4.current)->field_1).value.second;
  if ((flags.m_bits & 2) != 0) {
LAB_00276c8f:
    for (; SVar1 = (pSVar10->super_Symbol).kind, SVar1 == TransparentMember;
        pSVar10 = (SubroutineSymbol *)(pSVar10->super_Scope).compilation) {
    }
    if ((int)SVar1 < 0x31) {
      if (SVar1 == ForwardingTypedef) {
        pSVar10 = (SubroutineSymbol *)result->found;
      }
      else {
        if (SVar1 != ModportClocking) {
LAB_00276cc9:
          result->found = &pSVar10->super_Symbol;
          goto LAB_00276cef;
        }
        pSVar10 = (SubroutineSymbol *)(pSVar10->super_Scope).compilation;
        result->found = (Symbol *)pSVar10;
      }
    }
    else if (SVar1 == ExplicitImport) {
      pSVar10 = (SubroutineSymbol *)
                ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)pSVar10);
      result->found = (Symbol *)pSVar10;
      result->wasImported = true;
    }
    else {
      if (SVar1 != MethodPrototype) goto LAB_00276cc9;
      pSVar10 = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar10);
      result->found = &pSVar10->super_Symbol;
    }
    if (pSVar10 == (SubroutineSymbol *)0x0) {
      return;
    }
LAB_00276cef:
    pDVar11 = Symbol::getDeclaredType(&pSVar10->super_Symbol);
    if ((pDVar11 != (DeclaredType *)0x0) && ((pDVar11->field_0x3f & 0x40) != 0)) {
      if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
        pSVar6 = result->found;
        range_01.endLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
        range_01.startLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
        pDVar7 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x23000a,range_01);
        arg_01._M_str = local_130._M_str;
        arg_01._M_len = local_130._M_len;
        Diagnostic::operator<<(pDVar7,arg_01);
        Diagnostic::addNote(pDVar7,(DiagCode)0x40001,pSVar6->location);
      }
      result->found = (Symbol *)0x0;
    }
    return;
  }
  if (((pSVar12 != (Scope *)0x0) &&
      (pSVar2 = (pSVar10->super_Symbol).parentScope, pSVar2 != (Scope *)0x0)) && (pSVar2 != pSVar12)
     ) goto LAB_00276e01;
  if ((pSVar10->super_Symbol).indexInScope < SVar14) goto LAB_00276c8f;
  SVar1 = (pSVar10->super_Symbol).kind;
  if ((int)SVar1 < 0x41) {
    if (SVar1 == ClassType) {
      lVar16 = 0xa8;
    }
    else {
      if (SVar1 != TypeAlias) {
        if (SVar1 == Subroutine) goto LAB_00276b2a;
        goto LAB_002766ae;
      }
      lVar16 = 0x90;
    }
LAB_00276c4f:
    lVar16 = *(long *)((long)&(pSVar10->super_Symbol).kind + lVar16);
    if (lVar16 != 0) {
      if (((pSVar12 != (Scope *)0x0) && (*(Scope **)(lVar16 + 0x20) != (Scope *)0x0)) &&
         (*(Scope **)(lVar16 + 0x20) != pSVar12)) {
LAB_00276e01:
        assert::assertFailed
                  ("scope == other.scope || !scope || !other.scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Lookup.cpp"
                   ,0x34,"bool slang::ast::LookupLocation::operator<(const LookupLocation &) const")
        ;
      }
      SVar17 = *(SymbolIndex *)(lVar16 + 0x30);
      result->fromForwardTypedef = true;
      if (SVar17 < SVar14) goto LAB_00276c8f;
    }
  }
  else {
    if (SVar1 - Sequence < 2) goto LAB_00276c8f;
    if (SVar1 == GenericClassDef) {
      lVar16 = 0x210;
      goto LAB_00276c4f;
    }
    if (SVar1 == MethodPrototype) {
LAB_00276b2a:
      if (((pSVar10->declaredReturnType).field_0x3f & 0x40) != 0) {
        unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()(&local_a0,(Symbol *)pSVar10);
        return;
      }
      pTVar8 = DeclaredType::getType(&pSVar10->declaredReturnType);
      pTVar9 = pTVar8->canonical;
      if (pTVar9 == (Type *)0x0) {
        Type::resolveCanonical(pTVar8);
        pTVar9 = pTVar8->canonical;
      }
      if ((pTVar9->super_Symbol).kind == VoidType) goto LAB_00276c8f;
    }
  }
LAB_002766ae:
  sVar20 = Scope::getWildcardImports(scope);
  local_120 = sVar20.size_;
  local_a8 = sVar20.data_;
  if (local_120 == 0) {
LAB_00276a3f:
    local_120 = sVar20.size_;
    local_a8 = sVar20.data_;
    pSVar6 = scope->thisSym;
    pSVar12 = pSVar6->parentScope;
    if (pSVar12 == (Scope *)0x0) {
      return;
    }
    SVar14 = pSVar6->indexInScope + 1;
    SVar1 = pSVar6->kind;
    if (SVar1 == ConstraintBlock) {
      SVar17 = (SymbolIndex)pSVar6[2].name._M_len;
      outOfBlockIndex = SVar14;
    }
    else if (SVar1 == Subroutine) {
      SVar17 = pSVar6[3].kind;
      outOfBlockIndex = SVar14;
    }
    else {
      SVar17 = 0;
      if ((outOfBlockIndex == 0) && (outOfBlockIndex = SVar14, SVar1 == ClassType)) {
        if (pSVar6[1].indexInScope != 0) {
          Scope::elaborate((Scope *)&pSVar6[1].name);
          sVar20.size_ = local_120;
          sVar20.data_ = local_a8;
        }
        local_120 = sVar20.size_;
        local_a8 = sVar20.data_;
        pTVar9 = (Type *)pSVar6[2].name._M_len;
        SVar17 = 0;
        if (pTVar9 == (Type *)0x0) {
          bVar19 = false;
        }
        else {
          pTVar8 = pTVar9->canonical;
          if (pTVar8 == (Type *)0x0) {
            Type::resolveCanonical(pTVar9);
            sVar20.size_ = local_120;
            sVar20.data_ = local_a8;
            pTVar8 = pTVar9->canonical;
          }
          bVar19 = (pTVar8->super_Symbol).kind == ErrorType;
        }
        result->suppressUndeclared = (bool)(result->suppressUndeclared | bVar19);
      }
    }
    local_120 = sVar20.size_;
    local_a8 = sVar20.data_;
    name_00._M_str = local_130._M_str;
    name_00._M_len = local_130._M_len;
    sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._17_7_ =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._17_7_;
    sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_engaged =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_engaged;
    sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    location_00.index = outOfBlockIndex;
    location_00.scope = pSVar12;
    location_00._12_4_ = 0;
    unqualifiedImpl(pSVar12,name_00,location_00,sourceRange_00,flags,SVar17,result);
    return;
  }
  local_110 = local_f8;
  local_108 = 0;
  local_100 = 4;
  local_80.ptr = (sherwood_v3_entry<const_slang::ast::Symbol_*> *)&local_80;
  local_b8 = pSVar10;
  local_58.super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>.
  storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL> *)
            local_80.ptr;
  local_58.entries = ska::detailv3::empty_default_table<slang::ast::Symbol_const*>();
  sVar13 = 0;
  local_58.num_slots_minus_one = 0;
  local_58.hash_policy.shift = '?';
  local_58.max_lookups = '\x03';
  local_58._max_load_factor = 0.5;
  local_58.num_elements = 0;
  local_120 = local_120 << 3;
  local_b0 = scope;
  do {
    this_00 = *(WildcardImportSymbol **)((long)local_a8 + sVar13);
    pSVar2 = (this_00->super_Symbol).parentScope;
    if (((pSVar2 != (Scope *)0x0) && (pSVar12 != (Scope *)0x0)) && (pSVar2 != pSVar12)) {
      assert::assertFailed
                ("scope == other.scope || !scope || !other.scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Lookup.cpp"
                 ,0x34,"bool slang::ast::LookupLocation::operator<(const LookupLocation &) const");
    }
    if (SVar14 < (this_00->super_Symbol).indexInScope + 1) break;
    pPVar5 = WildcardImportSymbol::getPackage(this_00);
    if (pPVar5 == (PackageSymbol *)0x0) {
      result->suppressUndeclared = true;
    }
    else {
      lookupName._M_str = local_130._M_str;
      lookupName._M_len = local_130._M_len;
      local_118 = PackageSymbol::findForImport(pPVar5,lookupName);
      if ((local_118 != (Symbol *)0x0) &&
         (pVar21 = ska::detailv3::
                   sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
                   ::emplace<slang::ast::Symbol_const*&>
                             ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
                               *)&local_58,&local_118), uVar3 = local_108, pSVar6 = local_118,
         ((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        plVar15 = local_110 + local_108 * 2;
        if (local_108 == local_100) {
          if (-local_108 == -0x7fffffffffffffff) {
            detail::throwLengthError();
          }
          capacity = local_108 + 1;
          if (local_108 + 1 < local_108 * 2) {
            capacity = local_108 * 2;
          }
          if (-local_108 + 0x7fffffffffffffff < local_108) {
            capacity = 0x7fffffffffffffff;
          }
          __dest = (long *)detail::allocArray(capacity,0x10);
          __dest[uVar3 * 2] = (long)pSVar6;
          __dest[uVar3 * 2 + 1] = (long)this_00;
          __n = local_108 * 0x10;
          if (local_110 + local_108 * 2 == plVar15) {
            plVar15 = local_110;
            __dest_00 = __dest;
            if (local_108 != 0) goto LAB_002768ad;
          }
          else {
            if (local_110 != plVar15) {
              memmove(__dest,local_110,(long)plVar15 - (long)local_110);
            }
            __n = (long)local_110 + (local_108 * 0x10 - (long)plVar15);
            if (__n != 0) {
              __dest_00 = __dest + uVar3 * 2 + 2;
LAB_002768ad:
              memmove(__dest_00,plVar15,__n);
            }
          }
          if (local_110 != local_f8) {
            free(local_110);
          }
          local_108 = local_108 + 1;
          scope = local_b0;
          local_110 = __dest;
          local_100 = capacity;
        }
        else {
          *plVar15 = (long)local_118;
          plVar15[1] = (long)this_00;
          local_108 = local_108 + 1;
          if (local_108 == 0) {
            assert::assertFailed
                      ("len",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                       ,0x62,"reference slang::SmallVectorBase<Import>::back() [T = Import]");
          }
        }
      }
    }
    sVar13 = sVar13 + 8;
  } while (local_120 != sVar13);
  pSVar10 = local_b8;
  if (local_108 == 0) {
    ska::detailv3::
    sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
    ::~sherwood_v3_table(&local_58);
    sVar20.size_ = local_120;
    sVar20.data_ = local_a8;
    if (local_110 != local_f8) {
      free(local_110);
      sVar20.size_ = local_120;
      sVar20.data_ = local_a8;
    }
    goto LAB_00276a3f;
  }
  if (local_108 != 1) {
    if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
      range_00.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      range_00.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      pDVar7 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0xa,range_00);
      arg_00._M_str = local_130._M_str;
      arg_00._M_len = local_130._M_len;
      Diagnostic::operator<<(pDVar7,arg_00);
      plVar15 = local_110;
      if (local_108 != 0) {
        lVar18 = local_108 << 4;
        lVar16 = 0;
        do {
          Diagnostic::addNote(pDVar7,(DiagCode)0x39000a,
                              *(SourceLocation *)(*(long *)((long)plVar15 + lVar16 + 8) + 0x18));
          Diagnostic::addNote(pDVar7,(DiagCode)0x40001,
                              *(SourceLocation *)(*(long *)((long)plVar15 + lVar16) + 0x18));
          lVar16 = lVar16 + 0x10;
        } while (lVar18 != lVar16);
      }
    }
    goto LAB_00276bb1;
  }
  if ((local_b8 == (SubroutineSymbol *)0x0) ||
     (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged != true)) {
    result->wasImported = true;
LAB_00276b6c:
    symbol = (Symbol *)*local_110;
  }
  else {
    if ((local_b8->super_Symbol).kind != ExplicitImport) {
LAB_00276964:
      range.endLoc = sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      range.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      pDVar7 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0xb000a,range);
      arg._M_str = local_130._M_str;
      arg._M_len = local_130._M_len;
      Diagnostic::operator<<(pDVar7,arg);
      Diagnostic::addNote(pDVar7,(DiagCode)0x40001,(pSVar10->super_Symbol).location);
      if ((local_108 == 0) ||
         (Diagnostic::addNote(pDVar7,(DiagCode)0x39000a,*(SourceLocation *)(local_110[1] + 0x18)),
         local_108 == 0)) {
        assert::assertFailed
                  ("index < len",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                   ,0x196,
                   "reference slang::SmallVectorBase<Import>::operator[](size_type) [T = Import]");
      }
      Diagnostic::addNote(pDVar7,(DiagCode)0x40001,*(SourceLocation *)(*local_110 + 0x18));
      result->wasImported = true;
      if (local_108 == 0) {
LAB_00276a04:
        assert::assertFailed
                  ("index < len",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                   ,0x196,
                   "reference slang::SmallVectorBase<Import>::operator[](size_type) [T = Import]");
      }
      goto LAB_00276b6c;
    }
    pSVar6 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)local_b8);
    if (local_108 == 0) goto LAB_00276a04;
    symbol = (Symbol *)*local_110;
    if (pSVar6 != symbol) goto LAB_00276964;
    result->wasImported = true;
  }
  result->found = symbol;
  do {
    pPVar5 = (PackageSymbol *)scope->thisSym;
    if ((pPVar5->super_Symbol).kind == Package) {
      PackageSymbol::noteImport(pPVar5,symbol);
      break;
    }
    scope = (pPVar5->super_Symbol).parentScope;
  } while (scope != (Scope *)0x0);
LAB_00276bb1:
  ska::detailv3::
  sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  ::~sherwood_v3_table(&local_58);
  if (local_110 == local_f8) {
    return;
  }
  free(local_110);
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = true;
        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            locationGood = LookupLocation::before(*symbol) < location;
            if (!locationGood) {
                // A type alias can have forward definitions, so check those locations as well.
                // The forward decls form a linked list that are always ordered by location,
                // so we only need to check the first one.
                const ForwardingTypedefSymbol* forward = nullptr;
                switch (symbol->kind) {
                    case SymbolKind::TypeAlias:
                        forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::ClassType:
                        forward = symbol->as<ClassType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::GenericClassDef:
                        forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                        break;
                    case SymbolKind::Subroutine: {
                        // Subroutines can be referenced before they are declared if they
                        // are tasks or return void (tasks are always set to have a void
                        // return type internally so we only need one check here).
                        //
                        // It's important to check that we're not in the middle of evaluating
                        // the return type before we try to access that return type or
                        // we'll hard fail.
                        auto& sub = symbol->as<SubroutineSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::MethodPrototype: {
                        // Same as above.
                        auto& sub = symbol->as<MethodPrototypeSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                        // Sequences and properties can always be referenced before declaration.
                        locationGood = true;
                        break;
                    default:
                        break;
                }

                if (forward) {
                    locationGood = LookupLocation::before(*forward) < location;
                    result.fromForwardTypedef = true;
                }
            }
        }

        if (locationGood) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            while (symbol->kind == SymbolKind::TransparentMember)
                symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.wasImported = true;
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating())
                    reportRecursiveError(*result.found);
            }

            return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    auto wildcardImports = scope.getWildcardImports();
    if (!wildcardImports.empty()) {
        struct Import {
            const Symbol* imported;
            const WildcardImportSymbol* import;
        };
        SmallVector<Import, 4> imports;
        SmallSet<const Symbol*, 2> importDedup;

        for (auto import : wildcardImports) {
            if (location < LookupLocation::after(*import))
                break;

            auto package = import->getPackage();
            if (!package) {
                result.suppressUndeclared = true;
                continue;
            }

            const Symbol* imported = package->findForImport(name);
            if (imported && importDedup.emplace(imported).second)
                imports.emplace_back(Import{imported, import});
        }

        if (!imports.empty()) {
            if (imports.size() > 1) {
                if (sourceRange) {
                    auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport, *sourceRange);
                    diag << name;
                    for (const auto& pair : imports) {
                        diag.addNote(diag::NoteImportedFrom, pair.import->location);
                        diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                    }
                }
                return;
            }

            if (symbol && sourceRange) {
                // The existing symbol might be an import for the thing we just imported
                // via wildcard, which is fine so don't error for that case.
                if (symbol->kind != SymbolKind::ExplicitImport ||
                    symbol->as<ExplicitImportSymbol>().importedSymbol() != imports[0].imported) {

                    auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                    diag << name;
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                    diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                    diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                }
            }

            result.wasImported = true;
            result.found = imports[0].imported;

            // If we are doing this lookup from a scope that is within a package declaration
            // we should note that fact so that it can later be exported if desired.
            auto currScope = &scope;
            do {
                auto& sym = currScope->asSymbol();
                if (sym.kind == SymbolKind::Package) {
                    sym.as<PackageSymbol>().noteImport(*result.found);
                    break;
                }

                currScope = sym.getParentScope();
            } while (currScope);

            return;
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }
    else if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        result.suppressUndeclared |= baseClass && baseClass->isError();
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result);
}